

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_start_resolving(nn_ctcp *self)

{
  nn_ep *self_00;
  char *pcVar1;
  long in_RDI;
  size_t ipv4onlylen;
  int ipv4only;
  char *end;
  char *begin;
  char *addr;
  char *in_stack_00000038;
  nn_dns *in_stack_00000040;
  size_t *in_stack_ffffffffffffffd8;
  nn_ep *pnVar2;
  
  self_00 = (nn_ep *)nn_ep_getaddr(*(nn_ep **)(in_RDI + 0x60));
  pcVar1 = strchr((char *)self_00,0x3b);
  pnVar2 = self_00;
  if (pcVar1 != (char *)0x0) {
    pnVar2 = (nn_ep *)(pcVar1 + 1);
  }
  pcVar1 = strrchr((char *)self_00,0x3a);
  if (pcVar1 == (char *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","end",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x1fd);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_ep_getopt(self_00,(int)((ulong)pnVar2 >> 0x20),(int)pnVar2,pcVar1,in_stack_ffffffffffffffd8);
  nn_dns_start(in_stack_00000040,in_stack_00000038,(size_t)self,addr._4_4_,(nn_dns_result *)begin);
  *(undefined4 *)(in_RDI + 0x58) = 2;
  return;
}

Assistant:

static void nn_ctcp_start_resolving (struct nn_ctcp *self)
{
    const char *addr;
    const char *begin;
    const char *end;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Extract the hostname part from address string. */
    addr = nn_ep_getaddr (self->ep);
    begin = strchr (addr, ';');
    if (!begin)
        begin = addr;
    else
        ++begin;
    end = strrchr (addr, ':');
    nn_assert (end);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  TODO: Get the actual value of IPV4ONLY option. */
    nn_dns_start (&self->dns, begin, end - begin, ipv4only, &self->dns_result);

    self->state = NN_CTCP_STATE_RESOLVING;
}